

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O1

Dar_Cut_t * Dar_ObjPrepareCuts(Dar_Man_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  int iVar4;
  Dar_Cut_t *__s;
  undefined1 *puVar5;
  void **ppvVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  
  if ((pObj->field_5).pData != (void *)0x0) {
    __assert_fail("Dar_ObjCuts(pObj) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                  ,0x2a0,"Dar_Cut_t *Dar_ObjPrepareCuts(Dar_Man_t *, Aig_Obj_t *)");
  }
  pObj->field_0x1f = (char)p->pPars->nCutsMax;
  __s = (Dar_Cut_t *)Aig_MmFixedEntryFetch(p->pMemCuts);
  memset(__s,0,(long)p->pPars->nCutsMax * 0x18);
  if ((pObj->field_0x18 & 7) == 0) {
    __assert_fail("!Aig_ObjIsNone(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darInt.h"
                  ,0x6c,"void Dar_ObjSetCuts(Aig_Obj_t *, Dar_Cut_t *)");
  }
  (pObj->field_5).pData = __s;
  if (0xffffffffffffff < *(ulong *)&pObj->field_0x18) {
    puVar5 = &__s->field_0x4;
    uVar7 = 0;
    do {
      puVar5[3] = puVar5[3] & 0xef;
      uVar7 = uVar7 + 1;
      puVar5 = puVar5 + 0x18;
    } while (uVar7 < (byte)pObj->field_0x1f);
  }
  pVVar2 = p->vCutNodes;
  uVar7 = pVVar2->nCap;
  if (pVVar2->nSize == uVar7) {
    if ((int)uVar7 < 0x10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(pVVar2->pArray,0x80);
      }
      pVVar2->pArray = ppvVar6;
      iVar9 = 0x10;
    }
    else {
      iVar9 = uVar7 * 2;
      if (iVar9 <= (int)uVar7) goto LAB_004f2ce3;
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar7 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(pVVar2->pArray,(ulong)uVar7 << 4);
      }
      pVVar2->pArray = ppvVar6;
    }
    pVVar2->nCap = iVar9;
  }
LAB_004f2ce3:
  iVar9 = pVVar2->nSize;
  pVVar2->nSize = iVar9 + 1;
  pVVar2->pArray[iVar9] = pObj;
  uVar7 = *(uint *)&__s->field_0x4;
  *(uint *)&__s->field_0x4 = uVar7 | 0x10000000;
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                  ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x18 & 7) == 1) {
    *(uint *)&__s->field_0x4 = uVar7 & 0x1fffffff | 0x10000000;
    __s->uSign = 0;
    uVar7 = uVar7 & 0x1fff0000 | 0x1000ffff;
  }
  else {
    *(uint *)&__s->field_0x4 = uVar7 & 0x1fffffff | 0x30000000;
    __s->pLeaves[0] = pObj->Id;
    __s->uSign = 1 << ((byte)pObj->Id & 0x1f);
    uVar7 = uVar7 & 0x1fff0000 | 0x3000aaaa;
  }
  *(uint *)&__s->field_0x4 = uVar7;
  if ((uVar7 >> 0x1c & 1) == 0) {
    __assert_fail("pCut->fUsed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCut.c"
                  ,0x6e,"int Dar_CutFindValue(Dar_Man_t *, Dar_Cut_t *)");
  }
  uVar8 = 0x3e90000;
  if (0x1fffffff < uVar7) {
    pVVar2 = p->pAig->vObjs;
    if (pVVar2 != (Vec_Ptr_t *)0x0) {
      uVar1 = __s->pLeaves[0];
      if (((int)uVar1 < 0) || (pVVar2->nSize <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (pVVar2->pArray[uVar1] != (void *)0x0) goto LAB_004f2db2;
    }
    uVar8 = 0;
  }
LAB_004f2db2:
  *(uint *)&__s->field_0x4 = uVar7 & 0x3800ffff | uVar8;
  iVar9 = p->nCutMemUsed;
  iVar3 = Aig_MmFixedReadMemUsage(p->pMemCuts);
  iVar4 = iVar3 + 0xfffff;
  if (-1 < iVar3) {
    iVar4 = iVar3;
  }
  if (iVar9 < iVar4 >> 0x14) {
    iVar4 = Aig_MmFixedReadMemUsage(p->pMemCuts);
    iVar9 = iVar4 + 0xfffff;
    if (-1 < iVar4) {
      iVar9 = iVar4;
    }
    p->nCutMemUsed = iVar9 >> 0x14;
  }
  return __s;
}

Assistant:

Dar_Cut_t * Dar_ObjPrepareCuts( Dar_Man_t * p, Aig_Obj_t * pObj )
{
    Dar_Cut_t * pCutSet, * pCut;
    int i;
    assert( Dar_ObjCuts(pObj) == NULL );
    pObj->nCuts = p->pPars->nCutsMax;
    // create the cutset of the node
    pCutSet = (Dar_Cut_t *)Aig_MmFixedEntryFetch( p->pMemCuts );
    memset( pCutSet, 0, p->pPars->nCutsMax * sizeof(Dar_Cut_t) );
    Dar_ObjSetCuts( pObj, pCutSet );
    Dar_ObjForEachCutAll( pObj, pCut, i )
        pCut->fUsed = 0;
    Vec_PtrPush( p->vCutNodes, pObj );
    // add unit cut if needed
    pCut = pCutSet;
    pCut->fUsed = 1;
    if ( Aig_ObjIsConst1(pObj) )
    {
        pCut->nLeaves = 0;
        pCut->uSign = 0;
        pCut->uTruth = 0xFFFF;
    }
    else
    {
        pCut->nLeaves = 1;
        pCut->pLeaves[0] = pObj->Id;
        pCut->uSign = Aig_ObjCutSign( pObj->Id );
        pCut->uTruth = 0xAAAA;
    }
    pCut->Value = Dar_CutFindValue( p, pCut );
    if ( p->nCutMemUsed < Aig_MmFixedReadMemUsage(p->pMemCuts)/(1<<20) )
        p->nCutMemUsed = Aig_MmFixedReadMemUsage(p->pMemCuts)/(1<<20);
    return pCutSet;
}